

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

string * __thiscall
pstack::Elf::Object::getInterpreter_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  bool bVar1;
  ProgramHeaders *this_00;
  element_type *peVar2;
  allocator<char> local_39;
  reference local_38;
  anon_struct_56_8_fb3e104e *seg;
  const_iterator __end2;
  const_iterator __begin2;
  ProgramHeaders *__range2;
  Object *this_local;
  
  this_00 = getSegments(this,3);
  __end2 = std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::begin(this_00);
  seg = (anon_struct_56_8_fb3e104e *)
        std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(this_00);
  bVar1 = __gnu_cxx::
          operator==<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                    (&__end2,(__normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                              *)&seg);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    local_38 = __gnu_cxx::
               __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
               ::operator*(&__end2);
    peVar2 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->io);
    (*peVar2->_vptr_Reader[7])(__return_storage_ptr__,peVar2,local_38->p_offset);
  }
  return __return_storage_ptr__;
}

Assistant:

string
Object::getInterpreter() const
{
    for (auto &seg : getSegments(PT_INTERP))
        return io->readString(seg.p_offset);
    return "";
}